

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugPubTable.cpp
# Opt level: O3

void __thiscall llvm::DWARFDebugPubTable::dump(DWARFDebugPubTable *this,raw_ostream *OS)

{
  char *pcVar1;
  _func_int **pp_Var2;
  raw_ostream *prVar3;
  char *pcVar4;
  void *__buf;
  size_t sVar5;
  char *extraout_RDX;
  void *__buf_00;
  void *__buf_01;
  char *extraout_RDX_00;
  char *pcVar6;
  pointer pEVar7;
  pointer pSVar8;
  GDBIndexEntryLinkage *pGVar9;
  pointer pEVar10;
  bool bVar11;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  StringRef SVar12;
  StringRef SVar13;
  format_object_base local_98;
  char *local_88;
  pointer local_80;
  pointer local_78;
  _func_int **local_70;
  _func_int **local_68;
  _func_int **local_60;
  _func_int **local_58;
  pointer local_50;
  format_object_base local_48;
  char *local_38;
  
  pSVar8 = (this->Sets).
           super__Vector_base<llvm::DWARFDebugPubTable::Set,_std::allocator<llvm::DWARFDebugPubTable::Set>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_78 = (this->Sets).
             super__Vector_base<llvm::DWARFDebugPubTable::Set,_std::allocator<llvm::DWARFDebugPubTable::Set>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar8 != local_78) {
    local_70 = (_func_int **)&PTR_home_01077fa8;
    local_68 = (_func_int **)&PTR_home_010780d0;
    local_60 = (_func_int **)&PTR_home_01077fc8;
    local_58 = (_func_int **)&PTR_home_010782f8;
    do {
      SVar12.Length = 9;
      SVar12.Data = "length = ";
      prVar3 = raw_ostream::operator<<(OS,SVar12);
      pp_Var2 = local_70;
      local_48.Fmt = "0x%08x";
      local_48._vptr_format_object_base = local_70;
      local_38 = (char *)CONCAT44(local_38._4_4_,pSVar8->Length);
      raw_ostream::operator<<(prVar3,&local_48);
      SVar13.Length = 0xb;
      SVar13.Data = " version = ";
      prVar3 = raw_ostream::operator<<(OS,SVar13);
      local_48.Fmt = "0x%04x";
      local_48._vptr_format_object_base = local_68;
      local_38 = (char *)CONCAT62(local_38._2_6_,pSVar8->Version);
      raw_ostream::operator<<(prVar3,&local_48);
      Str.Length = 0xf;
      Str.Data = " unit_offset = ";
      prVar3 = raw_ostream::operator<<(OS,Str);
      local_48.Fmt = "0x%08lx";
      local_48._vptr_format_object_base = local_60;
      local_38 = (char *)pSVar8->Offset;
      raw_ostream::operator<<(prVar3,&local_48);
      Str_00.Length = 0xd;
      Str_00.Data = " unit_size = ";
      prVar3 = raw_ostream::operator<<(OS,Str_00);
      local_48.Fmt = "0x%08x";
      local_48._vptr_format_object_base = pp_Var2;
      local_38 = (char *)CONCAT44(local_38._4_4_,pSVar8->Size);
      prVar3 = raw_ostream::operator<<(prVar3,&local_48);
      pcVar4 = prVar3->OutBufCur;
      if (pcVar4 < prVar3->OutBufEnd) {
        prVar3->OutBufCur = pcVar4 + 1;
        *pcVar4 = '\n';
      }
      else {
        raw_ostream::write(prVar3,10,__buf,(size_t)pcVar4);
      }
      bVar11 = this->GnuStyle != false;
      pcVar6 = "Offset     Name\n";
      if (bVar11) {
        pcVar6 = "Offset     Linkage  Kind     Name\n";
      }
      sVar5 = 0x10;
      if (bVar11) {
        sVar5 = 0x22;
      }
      Str_01.Length = sVar5;
      Str_01.Data = pcVar6;
      raw_ostream::operator<<(OS,Str_01);
      pEVar10 = (pSVar8->Entries).
                super__Vector_base<llvm::DWARFDebugPubTable::Entry,_std::allocator<llvm::DWARFDebugPubTable::Entry>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pEVar7 = (pSVar8->Entries).
               super__Vector_base<llvm::DWARFDebugPubTable::Entry,_std::allocator<llvm::DWARFDebugPubTable::Entry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_80 = pSVar8;
      if (pEVar10 != pEVar7) {
        pGVar9 = &(pEVar10->Descriptor).Linkage;
        local_50 = pEVar7;
        do {
          local_48.Fmt = "0x%8.8lx ";
          local_48._vptr_format_object_base = local_60;
          local_38 = *(char **)(pGVar9 + -3);
          raw_ostream::operator<<(OS,&local_48);
          pcVar6 = extraout_RDX;
          if (this->GnuStyle == true) {
            SVar12 = dwarf::GDBIndexEntryLinkageString(*pGVar9);
            SVar13 = dwarf::GDBIndexEntryKindString
                               (((PubIndexEntryDescriptor *)(pGVar9 + -1))->Kind);
            local_48.Fmt = "%-8s";
            local_48._vptr_format_object_base = local_58;
            local_38 = SVar12.Data;
            prVar3 = raw_ostream::operator<<(OS,&local_48);
            pcVar4 = prVar3->OutBufCur;
            if (pcVar4 < prVar3->OutBufEnd) {
              prVar3->OutBufCur = pcVar4 + 1;
              *pcVar4 = ' ';
            }
            else {
              prVar3 = (raw_ostream *)raw_ostream::write(prVar3,0x20,__buf_00,(size_t)pcVar4);
            }
            local_98.Fmt = "%-8s";
            local_98._vptr_format_object_base = local_58;
            local_88 = SVar13.Data;
            prVar3 = raw_ostream::operator<<(prVar3,&local_98);
            pcVar4 = prVar3->OutBufCur;
            if (pcVar4 < prVar3->OutBufEnd) {
              pcVar6 = pcVar4 + 1;
              prVar3->OutBufCur = pcVar6;
              *pcVar4 = ' ';
              pEVar7 = local_50;
            }
            else {
              raw_ostream::write(prVar3,0x20,__buf_01,(size_t)pcVar4);
              pcVar6 = extraout_RDX_00;
              pEVar7 = local_50;
            }
          }
          pcVar1 = OS->OutBufCur;
          if (pcVar1 < OS->OutBufEnd) {
            pcVar4 = pcVar1 + 1;
            OS->OutBufCur = pcVar4;
            *pcVar1 = '\"';
            prVar3 = OS;
          }
          else {
            prVar3 = (raw_ostream *)raw_ostream::write(OS,0x22,pcVar6,(size_t)pcVar4);
          }
          prVar3 = raw_ostream::operator<<(prVar3,*(StringRef *)(pGVar9 + 1));
          Str_02.Length = 2;
          Str_02.Data = "\"\n";
          raw_ostream::operator<<(prVar3,Str_02);
          pEVar10 = (pointer)(pGVar9 + 5);
          pGVar9 = pGVar9 + 8;
        } while (pEVar10 != pEVar7);
      }
      pSVar8 = local_80 + 1;
    } while (pSVar8 != local_78);
  }
  return;
}

Assistant:

void DWARFDebugPubTable::dump(raw_ostream &OS) const {
  for (const Set &S : Sets) {
    OS << "length = " << format("0x%08x", S.Length);
    OS << " version = " << format("0x%04x", S.Version);
    OS << " unit_offset = " << format("0x%08" PRIx64, S.Offset);
    OS << " unit_size = " << format("0x%08x", S.Size) << '\n';
    OS << (GnuStyle ? "Offset     Linkage  Kind     Name\n"
                    : "Offset     Name\n");

    for (const Entry &E : S.Entries) {
      OS << format("0x%8.8" PRIx64 " ", E.SecOffset);
      if (GnuStyle) {
        StringRef EntryLinkage =
            GDBIndexEntryLinkageString(E.Descriptor.Linkage);
        StringRef EntryKind = dwarf::GDBIndexEntryKindString(E.Descriptor.Kind);
        OS << format("%-8s", EntryLinkage.data()) << ' '
           << format("%-8s", EntryKind.data()) << ' ';
      }
      OS << '\"' << E.Name << "\"\n";
    }
  }
}